

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# control_operation.cpp
# Opt level: O2

string * __thiscall
bidfx_public_api::price::pixie::ControlOperation::ToString_abi_cxx11_
          (string *__return_storage_ptr__,ControlOperation *this,ControlOperationEnum control)

{
  allocator<char> *__a;
  char *__s;
  allocator<char> local_b;
  allocator<char> local_a;
  allocator<char> local_9;
  
  if ((int)this == 0) {
    __s = "REFRESH";
    __a = &local_a;
  }
  else if ((int)this == 1) {
    __s = "TOGGLE";
    __a = &local_9;
  }
  else {
    __s = "NONE";
    __a = &local_b;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string ControlOperation::ToString(ControlOperationEnum control)
{
    if (control == ControlOperationEnum::TOGGLE)
    {
        return "TOGGLE";
    }
    else if (control == ControlOperationEnum::REFRESH)
    {
        return "REFRESH";
    }

    return "NONE";
}